

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmStateSnapshot::GetCallStackParent(cmStateSnapshot *__return_storage_ptr__,cmStateSnapshot *this)

{
  uint __line;
  bool bVar1;
  PointerType pSVar2;
  char *__assertion;
  iterator other;
  iterator other_00;
  PositionType parentPos;
  
  if (this->State == (cmState *)0x0) {
    __assertion = "this->State";
    __line = 0x57;
  }
  else {
    other.Tree = &this->State->SnapshotData;
    other.Position = 0;
    bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator!=
                      (&this->Position,other);
    if (bVar1) {
      (__return_storage_ptr__->Position).Position = 0;
      __return_storage_ptr__->State = (cmState *)0x0;
      (__return_storage_ptr__->Position).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0
      ;
      parentPos.Tree = (this->Position).Tree;
      parentPos.Position = (this->Position).Position;
      while ((pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                                 (&parentPos), pSVar2->SnapshotType == PolicyScopeType ||
             (pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                                 (&parentPos), pSVar2->SnapshotType == VariableScopeType))) {
        cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&parentPos);
      }
      pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&parentPos);
      if ((pSVar2->SnapshotType != BuildsystemDirectoryType) &&
         (pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&parentPos),
         pSVar2->SnapshotType != BaseType)) {
        do {
          do {
            cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator++(&parentPos);
            pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&parentPos)
            ;
          } while (pSVar2->SnapshotType == PolicyScopeType);
          pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&parentPos);
        } while (pSVar2->SnapshotType == VariableScopeType);
        other_00.Tree = &this->State->SnapshotData;
        other_00.Position = 0;
        bVar1 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator==
                          (&parentPos,other_00);
        if (!bVar1) {
          __return_storage_ptr__->State = this->State;
          (__return_storage_ptr__->Position).Tree = parentPos.Tree;
          (__return_storage_ptr__->Position).Position = parentPos.Position;
        }
      }
      return __return_storage_ptr__;
    }
    __assertion = "this->Position != this->State->SnapshotData.Root()";
    __line = 0x58;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStateSnapshot.cxx"
                ,__line,"cmStateSnapshot cmStateSnapshot::GetCallStackParent() const");
}

Assistant:

cmStateSnapshot cmStateSnapshot::GetCallStackParent() const
{
  assert(this->State);
  assert(this->Position != this->State->SnapshotData.Root());

  cmStateSnapshot snapshot;
  cmStateDetail::PositionType parentPos = this->Position;
  while (parentPos->SnapshotType == cmStateEnums::PolicyScopeType ||
         parentPos->SnapshotType == cmStateEnums::VariableScopeType) {
    ++parentPos;
  }
  if (parentPos->SnapshotType == cmStateEnums::BuildsystemDirectoryType ||
      parentPos->SnapshotType == cmStateEnums::BaseType) {
    return snapshot;
  }

  ++parentPos;
  while (parentPos->SnapshotType == cmStateEnums::PolicyScopeType ||
         parentPos->SnapshotType == cmStateEnums::VariableScopeType) {
    ++parentPos;
  }

  if (parentPos == this->State->SnapshotData.Root()) {
    return snapshot;
  }

  snapshot = cmStateSnapshot(this->State, parentPos);
  return snapshot;
}